

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_points.cpp
# Opt level: O0

void __thiscall
Am_Drawonable_Impl::Draw_Lines
          (Am_Drawonable_Impl *this,Am_Style *ls,Am_Style *fs,Am_Point_Array *pts,Am_Draw_Function f
          )

{
  Am_Wrapper *value;
  Am_Point_Array_Data *this_00;
  reference ar;
  size_type sVar1;
  Am_Point_Array_Data *data;
  Am_Draw_Function f_local;
  Am_Point_Array *pts_local;
  Am_Style *fs_local;
  Am_Style *ls_local;
  Am_Drawonable_Impl *this_local;
  
  value = Am_Point_Array::operator_cast_to_Am_Wrapper_(pts);
  this_00 = Am_Point_Array_Data::Narrow(value);
  if (this_00 != (Am_Point_Array_Data *)0x0) {
    ar = std::vector<XPoint,_std::allocator<XPoint>_>::operator[](&this_00->points,0);
    sVar1 = std::vector<XPoint,_std::allocator<XPoint>_>::size(&this_00->points);
    poly_draw_it(this,ls,fs,f,ar,(int)sVar1);
    Am_Wrapper::Release(&this_00->super_Am_Wrapper);
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::Draw_Lines(const Am_Style &ls, const Am_Style &fs,
                               const Am_Point_Array &pts, Am_Draw_Function f)
{
  Am_Point_Array_Data *data = Am_Point_Array_Data::Narrow(pts);

  if (data) {
    poly_draw_it(ls, fs, f, &data->points[0], (int)data->points.size());
    data->Release();
  }
}